

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ismine_tests.cpp
# Opt level: O2

ScriptPubKeyMan *
wallet::ismine_tests::CreateDescriptor(CWallet *keystore,string *desc_str,bool success)

{
  long lVar1;
  reference __r;
  ScriptPubKeyMan **ppSVar2;
  ScriptPubKeyMan *pSVar3;
  iterator pvVar4;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  shared_ptr<Descriptor> descriptor;
  int32_t next_index;
  check_type cVar5;
  allocator<char> local_2c1;
  ScriptPubKeyMan *local_2c0;
  element_type local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parsed_descs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  string local_250;
  WalletDescriptor w_desc;
  string error;
  FlatSigningProvider keys;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CWallet::SetWalletFlag(keystore,0x400000000);
  keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keys.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_0114ae68;
  keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  pvVar4 = (iterator)0x0;
  keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Parse(&parsed_descs,desc_str,&keys,&error,false);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/ismine_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = pvVar4;
  file.m_end = (iterator)0x1e;
  file.m_begin = (iterator)&local_288;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_298,msg);
  local_250._M_dataplus._M_p._0_1_ =
       (parsed_descs.
        super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
       parsed_descs.
       super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) != success;
  local_250._M_string_length = 0;
  local_250.field_2._M_allocated_capacity = 0;
  w_desc.id.super_base_blob<256U>.m_data._M_elems._8_8_ = &criticalblock4;
  criticalblock4.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_183c2ca;
  criticalblock4.super_unique_lock._8_8_ = (long)"success == (!parsed_descs.empty())" + 0x22;
  w_desc.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_1_ = 0;
  w_desc.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_0113a070;
  w_desc.id.super_base_blob<256U>.m_data._M_elems._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/ismine_tests.cpp"
  ;
  local_2a0 = "";
  next_index = 0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_250,(lazy_ostream *)&w_desc,1,0,WARN,_cVar5,
             (size_t)&local_2a8,0x1e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_250.field_2._M_allocated_capacity);
  if (success) {
    __r = std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::at(&parsed_descs,0);
    std::__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
              ((__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2> *)&local_2b8,__r);
    descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
    descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_2b8;
    WalletDescriptor::WalletDescriptor(&w_desc,descriptor,0,1,0,next_index);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b0);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock4,&keystore->cs_wallet,"keystore.cs_wallet",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/ismine_tests.cpp"
               ,0x26,false);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"",&local_2c1);
    local_2c0 = CWallet::AddWalletDescriptor(keystore,&w_desc,&keys,&local_250,false);
    ppSVar2 = inline_assertion_check<true,wallet::ScriptPubKeyMan*>
                        (&local_2c0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/ismine_tests.cpp"
                         ,0x28,"CreateDescriptor",
                         "keystore.AddWalletDescriptor(w_desc, keys, \"\", false)");
    pSVar3 = *ppSVar2;
    std::__cxx11::string::~string((string *)&local_250);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
    WalletDescriptor::~WalletDescriptor(&w_desc);
  }
  else {
    pSVar3 = (ScriptPubKeyMan *)0x0;
  }
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector(&parsed_descs);
  std::__cxx11::string::~string((string *)&error);
  FlatSigningProvider::~FlatSigningProvider(&keys);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pSVar3;
  }
  __stack_chk_fail();
}

Assistant:

wallet::ScriptPubKeyMan* CreateDescriptor(CWallet& keystore, const std::string& desc_str, const bool success)
{
    keystore.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);

    FlatSigningProvider keys;
    std::string error;
    auto parsed_descs = Parse(desc_str, keys, error, false);
    BOOST_CHECK(success == (!parsed_descs.empty()));
    if (!success) return nullptr;
    auto& desc = parsed_descs.at(0);

    const int64_t range_start = 0, range_end = 1, next_index = 0, timestamp = 1;

    WalletDescriptor w_desc(std::move(desc), timestamp, range_start, range_end, next_index);

    LOCK(keystore.cs_wallet);

    return Assert(keystore.AddWalletDescriptor(w_desc, keys,/*label=*/"", /*internal=*/false));
}